

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

ssize_t dma_write(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  ushort uVar1;
  ssize_t sVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  uint64_t dst_addr64;
  char pad [4];
  nettlp_hdr nh;
  undefined4 local_90;
  ushort uStack_8c;
  uint8_t uStack_8a;
  byte bStack_89;
  ulong local_88;
  undefined4 local_7c;
  iovec local_78;
  undefined4 *local_68;
  long local_60;
  ulong *local_58;
  long local_50;
  undefined4 *local_48;
  long local_40;
  void *local_38;
  size_t local_30;
  undefined4 *local_28;
  long local_20;
  undefined4 local_18;
  undefined2 local_14;
  
  local_48 = &local_7c;
  local_7c = 0;
  local_78.iov_base = &local_18;
  local_18 = 0;
  local_14 = 0;
  local_68 = &local_90;
  local_78.iov_len = 6;
  local_60 = 8;
  local_40 = 0;
  local_20 = 0;
  uVar3 = (uint)addr;
  if (addr < 0xffffffff) {
    local_90 = 0x40;
    local_88 = CONCAT44(local_88._4_4_,
                        uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                        (uVar3 & 0xfffffffc) << 0x18);
    local_50 = 4;
  }
  else {
    local_88 = addr >> 0x38 | (addr & 0xff000000000000) >> 0x28 | (addr & 0xff0000000000) >> 0x18 |
               (addr & 0xff00000000) >> 8 | (addr & 0xff000000) << 8 | (addr & 0xff0000) << 0x18 |
               (addr & 0xff00) << 0x28 | (addr & 0xfc) << 0x38;
    local_90 = 0x60;
    local_50 = 8;
  }
  local_58 = &local_88;
  uVar6 = count + addr;
  bVar10 = (uVar6 & 3) != 0;
  uVar9 = (count - 4) + addr;
  if (bVar10) {
    uVar9 = uVar6 & 0xfffffffffffffffc;
  }
  if (uVar9 <= (addr & 0xfffffffffffffffc)) {
    uVar9 = addr + 4;
  }
  bVar7 = ~(byte)(0xf << ((char)uVar6 - (char)uVar9 & 0x1fU)) & 0xf;
  if (uVar6 < uVar9) {
    bVar7 = 0;
  }
  uVar8 = ~(0xf << ((byte)count & 0x1f)) & 7;
  if (3 < count) {
    uVar8 = 0xf;
  }
  uVar8 = uVar8 << ((byte)addr & 3);
  _local_90 = CONCAT17(bVar7 << 4 | (byte)uVar8 & 0xf,
                       CONCAT16(nt->tag,CONCAT24(nt->requester << 8 | nt->requester >> 8,local_90)))
  ;
  uVar1 = (ushort)bVar10 + (short)((int)uVar6 - (uVar3 & 0x3fffc) >> 2);
  local_90 = CONCAT22(uVar1 * 0x100 | uVar1 >> 8,(undefined2)local_90);
  if (((uVar8 & 0xf) != 0) && ((uVar8 & 0xf) != 0xf)) {
    uVar3 = 0;
    local_40 = 0;
    do {
      local_40 = (local_40 + 1) - (ulong)(((uVar8 & 0xf) >> (uVar3 & 0x1f) & 1) != 0);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 3);
  }
  if ((bVar7 != 0) && (bVar7 != 0xf)) {
    iVar4 = 0;
    local_20 = 0;
    do {
      local_20 = local_20 + (ulong)(((uint)bVar7 << ((byte)iVar4 & 0x1f) & 8) == 0);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
  }
  local_38 = buf;
  local_30 = count;
  local_28 = local_48;
  sVar2 = writev(nt->sockfd,&local_78,6);
  uVar3 = (uint)sVar2;
  if ((int)uVar3 < 0) {
    lVar5 = (long)(int)uVar3;
  }
  else {
    uVar6 = local_60 + local_78.iov_len + local_50;
    lVar5 = -2;
    if (uVar6 <= (uVar3 & 0x7fffffff)) {
      lVar5 = (ulong)(uVar3 & 0x7fffffff) - (uVar6 + local_40 + local_20);
    }
  }
  return lVar5;
}

Assistant:

ssize_t dma_write(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret, n;
	char pad[4] = { 0, 0, 0, 0 };
	struct iovec iov[6];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);
	iov[3].iov_base = pad;
	iov[3].iov_len = 0;	/* if needed, increment for padding */
	iov[4].iov_base = buf;
	iov[4].iov_len = count;
	iov[5].iov_base = pad;
	iov[5].iov_len = 0;	/* if needed, increment for padding */


	/* build memory write request */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MWr);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_W_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_W_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));

	/* XXX:
	 * 
	 * 1st DW BE is used and not 0xF, move the buffer, if 1st DW
	 * is xx10, x100, or 1000. It needs padding.
	 */
	if (mh.fstdw && mh.fstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.fstdw & (0x1 << n)) == 0) {
				/* this byte is not used. padding! */
				iov[3].iov_len++;
			}
		}
	}

	if (mh.lstdw && mh.lstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.lstdw & (0x8 >> n)) == 0) {
				/* this byte is not used, padding! */
				iov[5].iov_len++;
			}
		}
	}


	ret = writev(nt->sockfd, iov, 6);
	if (ret < 0)
		return ret;

	if (ret < (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len)) {
		/* failed to write the whole packet */
		return -2;
	}

	return ret - (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len
		      + iov[3].iov_len + iov[5].iov_len);
}